

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Module.cpp
# Opt level: O0

Module * soul::Module::createProcessor(Program *p)

{
  Allocator *this;
  Module *pMVar1;
  ModuleType local_14;
  Program *local_10;
  Program *p_local;
  
  local_10 = p;
  this = Program::getAllocator(p);
  local_14 = processorModule;
  pMVar1 = heart::Allocator::allocate<soul::Module,soul::Program&,soul::Module::ModuleType>
                     (this,local_10,&local_14);
  return pMVar1;
}

Assistant:

Module& Module::createProcessor (Program& p)    { return p.getAllocator().allocate<Module> (p, ModuleType::processorModule); }